

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar5;
  int iVar6;
  
  iVar1 = (((((this->left_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar2 = (((this->left_->fadexpr_).right_)->dx_).num_elts;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  pFVar4 = (this->right_->fadexpr_).left_;
  pFVar5 = (this->right_->fadexpr_).right_;
  iVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  iVar3 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  iVar1 = (((((pFVar5->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar6 = (((((pFVar5->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  if (iVar6 < iVar3) {
    iVar6 = iVar3;
  }
  if (iVar6 < iVar2) {
    iVar6 = iVar2;
  }
  return iVar6;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }